

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::appendItem(QPDFObjectHandle *this,QPDFObjectHandle *item)

{
  Array array;
  allocator<char> local_51;
  Array local_50;
  string local_38;
  
  as_array(&local_50,this,strict);
  if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"ignoring attempt to append item",&local_51);
    typeWarning(this,"array",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    ::qpdf::Array::push_back(&local_50,item);
  }
  ::qpdf::Array::~Array(&local_50);
  return;
}

Assistant:

void
QPDFObjectHandle::appendItem(QPDFObjectHandle const& item)
{
    if (auto array = as_array(strict)) {
        array.push_back(item);
    } else {
        typeWarning("array", "ignoring attempt to append item");
        QTC::TC("qpdf", "QPDFObjectHandle array ignoring append item");
    }
}